

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_rank_many(roaring_bitmap_t *bm,uint32_t *begin,uint32_t *end,uint64_t *ans)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  uint8_t uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t *puVar9;
  uint uVar10;
  uint uVar11;
  run_container_t *prVar12;
  uint64_t *puVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ushort uVar19;
  uint64_t start_rank;
  
  if (begin != end && 0 < (bm->high_low_container).size) {
    start_rank = 0;
    iVar17 = 0;
    do {
      uVar2 = *begin;
      uVar8 = uVar2 >> 0x10;
      uVar11 = (uint)(bm->high_low_container).keys[iVar17];
      if (uVar11 < uVar8) {
        prVar12 = (run_container_t *)(bm->high_low_container).containers[iVar17];
        uVar4 = (bm->high_low_container).typecodes[iVar17];
        if (uVar4 == '\x04') {
          uVar4 = *(uint8_t *)&prVar12->runs;
          prVar12 = *(run_container_t **)prVar12;
        }
        if (uVar4 == '\x03') {
          iVar6 = run_container_cardinality(prVar12);
        }
        else {
          iVar6 = prVar12->n_runs;
        }
        start_rank = start_rank + (long)iVar6;
        iVar17 = iVar17 + 1;
      }
      else if (uVar8 == uVar11) {
        prVar12 = (run_container_t *)(bm->high_low_container).containers[iVar17];
        bVar5 = (bm->high_low_container).typecodes[iVar17];
        if (bVar5 == 4) {
          bVar5 = *(byte *)&prVar12->runs;
          prVar12 = *(run_container_t **)prVar12;
        }
        if (bVar5 == 3) {
          uVar8 = run_container_rank_many(prVar12,start_rank,begin,end,ans);
        }
        else {
          uVar7 = (ulong)bVar5;
          if (bVar5 == 2) {
            puVar9 = begin;
            if (begin != end) {
              uVar11 = 0;
              puVar15 = ans;
              do {
                uVar16 = *puVar9 ^ uVar2;
                if (uVar16 < 0x10000) {
                  uVar18 = (ulong)uVar11;
                  iVar6 = ~uVar11 + prVar12->n_runs;
                  uVar8 = 0;
                  puVar13 = puVar15;
                  do {
                    if (iVar6 < (int)uVar8) {
                      uVar10 = ~uVar8;
                      break;
                    }
                    uVar10 = uVar8 + iVar6 >> 1;
                    puVar14 = (uint64_t *)(ulong)uVar10;
                    uVar1 = *(ushort *)
                             ((long)&prVar12->runs->value +
                             (ulong)(uVar8 + iVar6 & 0xfffffffe) + uVar18 * 2);
                    uVar19 = (ushort)*puVar9;
                    if (uVar1 < uVar19) {
                      uVar8 = uVar10 + 1;
                      bVar3 = true;
                      puVar14 = puVar13;
                    }
                    else if (uVar19 < uVar1) {
                      iVar6 = uVar10 - 1;
                      bVar3 = true;
                      puVar14 = puVar13;
                    }
                    else {
                      bVar3 = false;
                    }
                    uVar10 = (uint)puVar14;
                    puVar13 = puVar14;
                  } while (bVar3);
                  uVar8 = ~uVar10;
                  if (-1 < (int)uVar10) {
                    uVar8 = uVar10 + 1;
                  }
                  if (-1 < (int)uVar10) {
                    uVar11 = uVar10 + 1;
                  }
                  *puVar15 = (ulong)uVar8 + uVar18 + start_rank;
                  puVar15 = puVar15 + 1;
                }
                else {
                  uVar7 = (ulong)((long)puVar9 - (long)begin) >> 2;
                }
                uVar8 = (uint)uVar7;
                if (0xffff < uVar16) goto LAB_0010f2e6;
                puVar9 = puVar9 + 1;
              } while (puVar9 != end);
            }
            uVar8 = (uint)((ulong)((long)puVar9 - (long)begin) >> 2);
          }
          else {
            uVar8 = bitset_container_rank_many
                              ((bitset_container_t *)prVar12,start_rank,begin,end,ans);
          }
        }
LAB_0010f2e6:
        begin = begin + uVar8;
        ans = ans + uVar8;
      }
      else {
        *ans = start_rank;
        ans = ans + 1;
        begin = begin + 1;
      }
    } while ((iVar17 < (bm->high_low_container).size) && (begin != end));
  }
  return;
}

Assistant:

void roaring_bitmap_rank_many(const roaring_bitmap_t *bm, const uint32_t *begin,
                              const uint32_t *end, uint64_t *ans) {
    uint64_t size = 0;

    int i = 0;
    const uint32_t *iter = begin;
    while (i < bm->high_low_container.size && iter != end) {
        uint32_t x = *iter;
        uint32_t xhigh = x >> 16;
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
            i++;
        } else if (xhigh == key) {
            uint32_t consumed = container_rank_many(
                bm->high_low_container.containers[i],
                bm->high_low_container.typecodes[i], size, iter, end, ans);
            iter += consumed;
            ans += consumed;
        } else {
            *(ans++) = size;
            iter++;
        }
    }
}